

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SccLiveness.cpp
# Opt level: O0

void __thiscall SCCLiveness::ExtendLifetime(SCCLiveness *this,Lifetime *lifetime,Instr *instr)

{
  uint uVar1;
  uint uVar2;
  SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  code *pcVar3;
  Loop **this_01;
  bool bVar4;
  BOOLEAN BVar5;
  uint32 uVar6;
  uint uVar7;
  undefined4 *puVar8;
  Type_conflict node;
  Type *ppLVar9;
  Type_conflict *ppSVar10;
  long *plVar11;
  long extraout_RDX;
  bool bVar12;
  Type local_e0;
  Loop **currLoop;
  Iterator __iter;
  uint local_78;
  bool isLifetimeExtended;
  bool loopAddedToList;
  uint32 uStack_74;
  bool isLiveOnBackEdge;
  uint32 extendedLifetimeEnd;
  uint32 extendedLifetimeStart;
  Loop *loop;
  StackSym *sym;
  Instr *instr_local;
  Lifetime *lifetime_local;
  SCCLiveness *this_local;
  bool local_39;
  SListNodeBase<Memory::ArenaAllocator> local_38;
  FreeFuncType freeFunc;
  Type local_28;
  NodeBase *next;
  NodeBase *current;
  SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount> *local_10;
  
  sym = (StackSym *)instr;
  instr_local = (Instr *)lifetime;
  lifetime_local = (Lifetime *)this;
  if (lifetime == (Lifetime *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                       ,0x2a7,"(lifetime != nullptr)","Lifetime not provided");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  if (instr_local->_vptr_Instr == (_func_int **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                       ,0x2a8,"(lifetime->sym != nullptr)","Lifetime has no symbol");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  bVar4 = SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount>::Empty
                    (this->extendedLifetimesLoopList);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                       ,0x2a9,"(this->extendedLifetimesLoopList->Empty())",
                       "this->extendedLifetimesLoopList->Empty()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  loop = (Loop *)instr_local->_vptr_Instr;
  _extendedLifetimeEnd = this->curLoop;
  uStack_74 = *(uint32 *)&instr_local[1].m_func;
  local_78 = *(uint *)((long)&instr_local[1].m_func + 4);
  __iter.current._7_1_ = 0;
  for (; __iter.current._6_1_ = 0, _extendedLifetimeEnd != (Loop *)0x0;
      _extendedLifetimeEnd = _extendedLifetimeEnd->parent) {
    BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                      ((_extendedLifetimeEnd->regAlloc).liveOnBackEdgeSyms,
                       *(BVIndex *)&loop->topFunc);
    if (BVar5 != '\0') {
      __iter.current._7_1_ = 1;
      if ((_extendedLifetimeEnd->regAlloc).loopStart < uStack_74) {
        uStack_74 = (_extendedLifetimeEnd->regAlloc).loopStart;
        SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount>::Prepend
                  (this->extendedLifetimesLoopList,&this->tempAlloc->super_ArenaAllocator,
                   (Loop **)&extendedLifetimeEnd);
        __iter.current._6_1_ = 1;
      }
      if ((local_78 < (_extendedLifetimeEnd->regAlloc).loopEnd) &&
         (local_78 = (_extendedLifetimeEnd->regAlloc).loopEnd, (__iter.current._6_1_ & 1) == 0)) {
        SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount>::Prepend
                  (this->extendedLifetimesLoopList,&this->tempAlloc->super_ArenaAllocator,
                   (Loop **)&extendedLifetimeEnd);
      }
    }
  }
  if ((__iter.current._7_1_ & 1) == 0) {
    uVar1 = *(uint *)((long)&instr_local[1].m_func + 4);
    uVar6 = IR::Instr::GetNumber((Instr *)sym);
    if (uVar1 < uVar6) {
      uVar6 = IR::Instr::GetNumber((Instr *)sym);
      *(uint32 *)((long)&instr_local[1].m_func + 4) = uVar6;
      uVar2 = this->totalOpHelperFullVisitedLength;
      uVar7 = CurrentOpHelperVisitedLength(this,(Instr *)sym);
      *(uint *)&instr_local[1].m_dst = uVar2 + uVar7;
    }
  }
  else {
    bVar4 = uStack_74 < *(uint *)&instr_local[1].m_func;
    if (bVar4) {
      *(uint32 *)&instr_local[1].m_func = uStack_74;
    }
    bVar12 = *(uint *)((long)&instr_local[1].m_func + 4) < local_78;
    if (bVar12) {
      *(uint *)((long)&instr_local[1].m_func + 4) = local_78;
    }
    __iter.current._5_1_ = bVar12 || bVar4;
    if ((bool)__iter.current._5_1_) {
      _currLoop = SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount>::GetIterator
                            (this->extendedLifetimesLoopList);
      while( true ) {
        this_local = (SCCLiveness *)&currLoop;
        if (__iter.list == (SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        this_01 = currLoop;
        node = SListNodeBase<Memory::ArenaAllocator>::Next
                         (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        bVar4 = SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                          ((SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount> *)this_01,node);
        if (!bVar4) {
          SListNodeBase<Memory::ArenaAllocator>::Next
                    (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        }
        local_39 = !bVar4;
        if (!local_39) break;
        ppLVar9 = SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                            ((Iterator *)&currLoop);
        SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Prepend
                  (((*ppLVar9)->regAlloc).extendedLifetime,(Lifetime **)&instr_local);
      }
    }
    bVar4 = IR::Instr::HasLazyBailOut((Instr *)sym);
    if (((bVar4) ||
        (uVar1 = *(uint *)((long)&instr_local[1].m_func + 4),
        uVar6 = IR::Instr::GetNumber((Instr *)sym), uVar1 <= uVar6)) &&
       ((bVar4 = IR::Instr::HasLazyBailOut((Instr *)sym), !bVar4 ||
        (uVar1 = *(uint *)((long)&instr_local[1].m_func + 4),
        uVar6 = IR::Instr::GetNumber((Instr *)sym), uVar1 < uVar6)))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                         ,0x2f9,
                         "((!instr->HasLazyBailOut() && lifetime->end > instr->GetNumber()) || (instr->HasLazyBailOut() && lifetime->end >= instr->GetNumber()))"
                         ,"Lifetime end not set correctly");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
  }
  this_00 = this->extendedLifetimesLoopList;
  current = (NodeBase *)this->tempAlloc;
  local_10 = this_00;
  ppSVar10 = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&this_00->super_SListNodeBase<Memory::ArenaAllocator>);
  next = *ppSVar10;
  while (bVar4 = SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount>::IsHead(this_00,next),
        ((bVar4 ^ 0xffU) & 1) != 0) {
    ppSVar10 = SListNodeBase<Memory::ArenaAllocator>::Next(next);
    local_28 = (Type)*ppSVar10;
    local_38.next = (Type)Memory::TypeAllocatorFunc<Memory::ArenaAllocator,_Loop_*>::GetFreeFunc();
    plVar11 = (long *)((long)&current->next + extraout_RDX);
    local_e0 = local_38.next;
    if (((ulong)local_38.next & 1) != 0) {
      local_e0 = *(Type *)((long)local_38.next + *plVar11 + -1);
    }
    (*(code *)local_e0)(plVar11,next,0x10);
    next = (NodeBase *)local_28;
  }
  SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount>::Reset(this_00);
  return;
}

Assistant:

void
SCCLiveness::ExtendLifetime(Lifetime *lifetime, IR::Instr *instr)
{
    AssertMsg(lifetime != nullptr, "Lifetime not provided");
    AssertMsg(lifetime->sym != nullptr, "Lifetime has no symbol");
    Assert(this->extendedLifetimesLoopList->Empty());

    // Find the loop that we need to extend the lifetime to
    StackSym * sym = lifetime->sym;
    Loop * loop = this->curLoop;
    uint32 extendedLifetimeStart = lifetime->start;
    uint32 extendedLifetimeEnd = lifetime->end;
    bool isLiveOnBackEdge = false;
    bool loopAddedToList = false;

    while (loop)
    {
        if (loop->regAlloc.liveOnBackEdgeSyms->Test(sym->m_id))
        {
            isLiveOnBackEdge = true;
            if (loop->regAlloc.loopStart < extendedLifetimeStart)
            {
                extendedLifetimeStart = loop->regAlloc.loopStart;
                this->extendedLifetimesLoopList->Prepend(this->tempAlloc, loop);
                loopAddedToList = true;
            }
            if (loop->regAlloc.loopEnd > extendedLifetimeEnd)
            {
                extendedLifetimeEnd = loop->regAlloc.loopEnd;
                if (!loopAddedToList)
                {
                    this->extendedLifetimesLoopList->Prepend(this->tempAlloc, loop);
                }
            }
        }
        loop = loop->parent;
        loopAddedToList = false;
    }

    if (!isLiveOnBackEdge)
    {
        // Don't extend lifetime to loop boundary if the use are not live on back edge
        // Note: the above loop doesn't detect a reg that is live on an outer back edge
        // but not an inner one, so we can't assume here that the lifetime hasn't been extended
        // past the current instruction.
        if (lifetime->end < instr->GetNumber())
        {
            lifetime->end = instr->GetNumber();
            lifetime->totalOpHelperLengthByEnd = this->totalOpHelperFullVisitedLength + CurrentOpHelperVisitedLength(instr);
        }
    }
    else
    {
        // extend lifetime to the outer most loop boundary that have the symbol live on back edge.
        bool isLifetimeExtended = false;
        if (lifetime->start > extendedLifetimeStart)
        {
            isLifetimeExtended = true;
            lifetime->start = extendedLifetimeStart;
        }

        if (lifetime->end < extendedLifetimeEnd)
        {
            isLifetimeExtended = true;
            lifetime->end = extendedLifetimeEnd;
            // The total op helper length by the end of this lifetime will be updated once we reach the loop tail
        }

        if (isLifetimeExtended)
        {
            // Keep track of the lifetime extended for this loop so we can update the call bits
            FOREACH_SLISTBASE_ENTRY(Loop *, currLoop, this->extendedLifetimesLoopList)
            {
                currLoop->regAlloc.extendedLifetime->Prepend(lifetime);
            }
            NEXT_SLISTBASE_ENTRY
        }
#if _M_ARM64
        // The case of equality is valid on Arm64 where some branch instructions have sources.
        AssertMsg(lifetime->end >= instr->GetNumber(), "Lifetime end not set correctly");
#else
        AssertMsg(
            (!instr->HasLazyBailOut() && lifetime->end > instr->GetNumber()) ||
            (instr->HasLazyBailOut() && lifetime->end >= instr->GetNumber()),
            "Lifetime end not set correctly"
        );
#endif
    }
    this->extendedLifetimesLoopList->Clear(this->tempAlloc);
}